

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::radial::u2_to_h2_std(radial *this,vec2 *u,vec3 *wi)

{
  vec3 vVar1;
  float_t z;
  double dVar2;
  undefined8 extraout_XMM0_Qa;
  vec3 local_68;
  float local_5c;
  float local_58;
  float_t y;
  float_t x;
  float_t s;
  float_t c;
  float_t nrm;
  float_t local_40;
  float local_38;
  float_t local_34;
  float_t z_i;
  float_t zi;
  vec3 *wi_local;
  vec2 *u_local;
  radial *this_local;
  float fStack_10;
  vec3 wm;
  
  local_34 = wi->z;
  _z_i = wi;
  wi_local = (vec3 *)u;
  u_local = (vec2 *)this;
  dVar2 = std::sqrt((double)(ulong)(uint)(wi->x * wi->x + wi->y * wi->y));
  z = SUB84(dVar2,0);
  local_38 = z;
  (*(this->super_microfacet).super_brdf._vptr_brdf[0x10])((ulong)(uint)local_34,this,wi_local);
  unique0x10000145 = extraout_XMM0_Qa;
  wm.x = z;
  if (0.0 < local_38) {
    s = 1.0 / local_38;
    x = _z_i->x * s;
    y = _z_i->y * s;
    this_local._4_4_ = (float)extraout_XMM0_Qa;
    fStack_10 = SUB84(extraout_XMM0_Qa,4);
    local_58 = x * this_local._4_4_ + -(y * fStack_10);
    local_5c = y * this_local._4_4_ + x * fStack_10;
    local_40 = z;
    vec3::vec3(&local_68,local_58,local_5c,z);
    this_local._4_4_ = local_68.x;
    fStack_10 = local_68.y;
    wm.x = local_68.z;
  }
  vVar1.z = wm.x;
  vVar1.x = this_local._4_4_;
  vVar1.y = fStack_10;
  return vVar1;
}

Assistant:

vec3 radial::u2_to_h2_std(const vec2 &u, const vec3 &wi) const
{
	float_t zi = wi.z;
	float_t z_i = sqrt(wi.x * wi.x + wi.y * wi.y);
	vec3 wm = u2_to_h2_std_radial(u, zi, z_i);

	// rotate for non-normal incidence
	if (z_i > 0) {
		float_t nrm = 1 / z_i;
		float_t c = wi.x * nrm;
		float_t s = wi.y * nrm;
		float_t x = c * wm.x - s * wm.y;
		float_t y = s * wm.x + c * wm.y;

		wm = vec3(x, y, wm.z);
	}

	return wm;
}